

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

bool __thiscall irr::gui::CGUITabControl::OnEvent(CGUITabControl *this,SEvent *event)

{
  IGUIElement *pIVar1;
  long *plVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  
  cVar3 = (**(code **)(*(long *)this + 0x90))();
  if (cVar3 != '\0') {
    if (event->EventType == EET_MOUSE_INPUT_EVENT) {
      if (((event->field_1).MouseInput.Event == EMIE_LMOUSE_LEFT_UP) &&
         (iVar5 = (**(code **)(*(long *)this + 0x180))
                            (this,(event->field_1).MouseInput.X,(event->field_1).MouseInput.Y),
         -1 < iVar5)) {
        (**(code **)(*(long *)this + 0x168))(this,iVar5);
        return true;
      }
    }
    else if ((event->EventType == EET_GUI_EVENT) &&
            ((event->field_1).GUIEvent.EventType == EGET_BUTTON_CLICKED)) {
      pIVar1 = (event->field_1).GUIEvent.Caller;
      if (pIVar1 == &this->UpButton->super_IGUIElement) {
        if (0 < this->CurrentScrollTabIndex) {
          this->CurrentScrollTabIndex = this->CurrentScrollTabIndex + -1;
        }
        recalculateScrollBar(this);
      }
      else {
        if (pIVar1 != &this->DownButton->super_IGUIElement) goto LAB_00228d93;
        scrollRight(this);
      }
      return true;
    }
  }
LAB_00228d93:
  plVar2 = *(long **)&this->field_0x20;
  if (plVar2 != (long *)0x0) {
    uVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,event);
    return (bool)uVar4;
  }
  return false;
}

Assistant:

bool CGUITabControl::OnEvent(const SEvent &event)
{
	if (isEnabled()) {
		switch (event.EventType) {
		case EET_GUI_EVENT:
			switch (event.GUIEvent.EventType) {
			case EGET_BUTTON_CLICKED:
				if (event.GUIEvent.Caller == UpButton) {
					scrollLeft();
					return true;
				} else if (event.GUIEvent.Caller == DownButton) {
					scrollRight();
					return true;
				}

				break;
			default:
				break;
			}
			break;
		case EET_MOUSE_INPUT_EVENT:
			switch (event.MouseInput.Event) {
			// case EMIE_LMOUSE_PRESSED_DOWN:
			//	// todo: dragging tabs around
			//	return true;
			case EMIE_LMOUSE_LEFT_UP: {
				s32 idx = getTabAt(event.MouseInput.X, event.MouseInput.Y);
				if (idx >= 0) {
					setActiveTab(idx);
					return true;
				}
				break;
			}
			default:
				break;
			}
			break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}